

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateRegionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateRegionSyntax,slang::syntax::GenerateRegionSyntax_const&>
          (BumpAllocator *this,GenerateRegionSyntax *args)

{
  GenerateRegionSyntax *pGVar1;
  GenerateRegionSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pGVar1 = (GenerateRegionSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::GenerateRegionSyntax::GenerateRegionSyntax(in_RSI,pGVar1);
  return pGVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }